

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_48f05::CleanTestCleanPhony::Run(CleanTestCleanPhony *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Test *pTVar1;
  int iVar2;
  TimeStamp TVar3;
  string err;
  Cleaner cleaner;
  allocator<char> local_11a;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  string local_d8;
  Cleaner local_b8;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  iVar2 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,"build phony: phony t1 t2\nbuild t1: cat\nbuild t2: cat\n",
              (ManifestParserOptions)0x0);
  if (iVar2 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"phony",(allocator<char> *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_11a);
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::Create(this_00,(string *)&local_b8,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"t1",(allocator<char> *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_11a);
    VirtualFileSystem::Create(this_00,(string *)&local_b8,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"t2",(allocator<char> *)&local_f8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_11a);
    VirtualFileSystem::Create(this_00,(string *)&local_b8,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_b8);
    Cleaner::Cleaner(&local_b8,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface)
    ;
    pTVar1 = g_current_test;
    iVar2 = Cleaner::CleanAll(&local_b8,false);
    testing::Test::Check
              (pTVar1,iVar2 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1ab,"0 == cleaner.CleanAll()");
    testing::Test::Check
              (g_current_test,local_b8.cleaned_files_count_ == 2,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1ac,"2 == cleaner.cleaned_files_count()");
    pTVar1 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"phony",(allocator<char> *)&local_f8);
    TVar3 = VirtualFileSystem::Stat(this_00,&local_118,&local_d8);
    testing::Test::Check
              (pTVar1,0 < TVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1ad,"0 < fs_.Stat(\"phony\", &err)");
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"t1",&local_11a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    VirtualFileSystem::Create(this_00,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"t2",&local_11a);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_119);
    VirtualFileSystem::Create(this_00,&local_118,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    pTVar1 = g_current_test;
    iVar2 = Cleaner::CleanTarget(&local_b8,"phony");
    testing::Test::Check
              (pTVar1,iVar2 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1b3,"0 == cleaner.CleanTarget(\"phony\")");
    testing::Test::Check
              (g_current_test,local_b8.cleaned_files_count_ == 2,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1b4,"2 == cleaner.cleaned_files_count()");
    pTVar1 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"phony",(allocator<char> *)&local_f8);
    TVar3 = VirtualFileSystem::Stat(this_00,&local_118,&local_d8);
    testing::Test::Check
              (pTVar1,0 < TVar3,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x1b5,"0 < fs_.Stat(\"phony\", &err)");
    std::__cxx11::string::~string((string *)&local_118);
    Cleaner::~Cleaner(&local_b8);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&local_d8);
  return;
}

Assistant:

TEST_F(CleanTest, CleanPhony) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build phony: phony t1 t2\n"
"build t1: cat\n"
"build t2: cat\n"));

  fs_.Create("phony", "");
  fs_.Create("t1", "");
  fs_.Create("t2", "");

  // Check that CleanAll does not remove "phony".
  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner.CleanAll());
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_LT(0, fs_.Stat("phony", &err));

  fs_.Create("t1", "");
  fs_.Create("t2", "");

  // Check that CleanTarget does not remove "phony".
  EXPECT_EQ(0, cleaner.CleanTarget("phony"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_LT(0, fs_.Stat("phony", &err));
}